

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

bool tcu::fuzzyCompare(TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,
                      Surface *result,float threshold,CompareLogMode logMode)

{
  bool bVar1;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  Surface::getAccess(&local_80,reference);
  Surface::getAccess(&local_58,result);
  bVar1 = fuzzyCompare(log,imageSetName,imageSetDesc,&local_80,&local_58,threshold,logMode);
  return bVar1;
}

Assistant:

bool fuzzyCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, float threshold, CompareLogMode logMode)
{
	return fuzzyCompare(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), threshold, logMode);
}